

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O3

void av1_get_nz_map_contexts_sse2
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  byte *pbVar1;
  int8_t *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  short sVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  undefined6 in_register_00000012;
  int col;
  long lVar38;
  int iVar39;
  int iVar40;
  uint8_t *puVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  ulong uVar46;
  long lVar47;
  int stride;
  long lVar48;
  int8_t *piVar49;
  ulong uVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  char cVar91;
  char cVar92;
  char cVar93;
  char cVar94;
  char cVar95;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  char cVar122;
  byte bVar123;
  char cVar124;
  byte bVar125;
  char cVar126;
  byte bVar127;
  char cVar128;
  byte bVar129;
  char cVar130;
  byte bVar131;
  char cVar132;
  byte bVar133;
  char cVar134;
  byte bVar135;
  char cVar136;
  byte bVar137;
  char cVar138;
  byte bVar139;
  char cVar140;
  byte bVar141;
  char cVar142;
  byte bVar143;
  char cVar144;
  byte bVar145;
  byte bVar146;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar152;
  byte bVar153;
  byte bVar154;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  byte bVar158;
  byte bVar159;
  byte bVar160;
  byte bVar161;
  byte bVar162;
  byte bVar163;
  byte bVar164;
  byte bVar165;
  byte bVar166;
  byte bVar167;
  byte bVar168;
  byte bVar169;
  byte bVar170;
  byte bVar171;
  byte bVar172;
  byte bVar173;
  byte bVar174;
  byte bVar175;
  byte bVar176;
  byte bVar177;
  byte bVar178;
  byte bVar179;
  byte bVar180;
  byte bVar181;
  byte bVar182;
  byte bVar183;
  byte bVar184;
  byte bVar185;
  byte bVar186;
  byte bVar187;
  byte bVar188;
  byte bVar189;
  byte bVar190;
  byte bVar191;
  byte bVar192;
  
  iVar37 = (int)CONCAT62(in_register_00000012,eob) + -1;
  if (iVar37 == 0) {
    *coeff_contexts = '\0';
    return;
  }
  uVar50 = (ulong)tx_size;
  uVar46 = 10;
  if (tx_size < 0x11) {
    uVar36 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_0024f062:
      uVar36 = uVar50;
    }
    iVar34 = tx_size_wide[uVar36];
    if (tx_size < 0x11) {
      uVar46 = 3;
      if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_0024f092:
        uVar46 = uVar50;
      }
    }
    else if (tx_size == '\x11') {
      uVar46 = 9;
    }
    else if (tx_size != '\x12') goto LAB_0024f092;
  }
  else {
    iVar34 = 0x20;
    if (tx_size != '\x12') {
      if (tx_size != '\x11') goto LAB_0024f062;
      uVar46 = 9;
      iVar34 = 0x10;
    }
  }
  iVar35 = tx_size_high[uVar46];
  iVar45 = iVar35 + 4;
  if (tx_class == '\x01') {
    lVar44 = (long)(iVar45 * 2);
    lVar38 = (long)(iVar45 * 3);
    lVar43 = (long)(iVar45 * 4);
    if (iVar35 == 4) {
      lVar48 = 0;
      cVar52 = '\x1a';
      cVar53 = '\x1a';
      cVar54 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1f';
      cVar57 = '\x1f';
      cVar58 = '\x1f';
      cVar51 = '\x1f';
      do {
        uVar14 = *(undefined4 *)(levels + lVar48 * 8 + 0x19);
        uVar15 = *(undefined4 *)(levels + lVar48 * 8 + 0x11);
        uVar16 = *(undefined4 *)(levels + lVar48 * 8 + 9);
        uVar17 = *(undefined4 *)(levels + lVar48 * 8 + 1);
        uVar18 = *(undefined4 *)(levels + lVar48 * 8 + 0x20);
        uVar19 = *(undefined4 *)(levels + lVar48 * 8 + 0x18);
        uVar20 = *(undefined4 *)(levels + lVar48 * 8 + 0x10);
        uVar21 = *(undefined4 *)(levels + lVar48 * 8 + 8);
        uVar22 = *(undefined4 *)(levels + lVar48 * 8 + lVar44 + 0x18);
        uVar23 = *(undefined4 *)(levels + lVar48 * 8 + lVar44 + 0x10);
        uVar24 = *(undefined4 *)(levels + lVar48 * 8 + lVar44 + 8);
        uVar25 = *(undefined4 *)(levels + lVar48 * 8 + lVar44);
        uVar26 = *(undefined4 *)(levels + lVar48 * 8 + lVar38 + 0x18);
        uVar27 = *(undefined4 *)(levels + lVar48 * 8 + lVar38 + 0x10);
        uVar28 = *(undefined4 *)(levels + lVar48 * 8 + lVar38 + 8);
        uVar29 = *(undefined4 *)(levels + lVar48 * 8 + lVar38);
        uVar30 = *(undefined4 *)(levels + lVar48 * 8 + lVar43 + 0x18);
        uVar31 = *(undefined4 *)(levels + lVar48 * 8 + lVar43 + 0x10);
        uVar32 = *(undefined4 *)(levels + lVar48 * 8 + lVar43 + 8);
        uVar33 = *(undefined4 *)(levels + lVar48 * 8 + lVar43);
        bVar177 = (byte)uVar17;
        bVar178 = (byte)((uint)uVar17 >> 8);
        bVar179 = (byte)((uint)uVar17 >> 0x10);
        bVar180 = (byte)((uint)uVar17 >> 0x18);
        bVar181 = (byte)uVar16;
        bVar182 = (byte)((uint)uVar16 >> 8);
        bVar183 = (byte)((uint)uVar16 >> 0x10);
        bVar184 = (byte)((uint)uVar16 >> 0x18);
        bVar185 = (byte)uVar15;
        bVar186 = (byte)((uint)uVar15 >> 8);
        bVar187 = (byte)((uint)uVar15 >> 0x10);
        bVar188 = (byte)((uint)uVar15 >> 0x18);
        bVar189 = (byte)uVar14;
        bVar190 = (byte)((uint)uVar14 >> 8);
        bVar191 = (byte)((uint)uVar14 >> 0x10);
        bVar192 = (byte)((uint)uVar14 >> 0x18);
        bVar101 = (byte)uVar21;
        bVar102 = (byte)((uint)uVar21 >> 8);
        bVar103 = (byte)((uint)uVar21 >> 0x10);
        bVar104 = (byte)((uint)uVar21 >> 0x18);
        bVar105 = (byte)uVar20;
        bVar106 = (byte)((uint)uVar20 >> 8);
        bVar107 = (byte)((uint)uVar20 >> 0x10);
        bVar108 = (byte)((uint)uVar20 >> 0x18);
        bVar109 = (byte)uVar19;
        bVar110 = (byte)((uint)uVar19 >> 8);
        bVar111 = (byte)((uint)uVar19 >> 0x10);
        bVar112 = (byte)((uint)uVar19 >> 0x18);
        bVar113 = (byte)uVar18;
        bVar114 = (byte)((uint)uVar18 >> 8);
        bVar115 = (byte)((uint)uVar18 >> 0x10);
        bVar116 = (byte)((uint)uVar18 >> 0x18);
        bVar117 = (byte)uVar25;
        bVar118 = (byte)((uint)uVar25 >> 8);
        bVar119 = (byte)((uint)uVar25 >> 0x10);
        bVar120 = (byte)((uint)uVar25 >> 0x18);
        bVar121 = (byte)uVar24;
        bVar123 = (byte)((uint)uVar24 >> 8);
        bVar125 = (byte)((uint)uVar24 >> 0x10);
        bVar127 = (byte)((uint)uVar24 >> 0x18);
        bVar129 = (byte)uVar23;
        bVar131 = (byte)((uint)uVar23 >> 8);
        bVar133 = (byte)((uint)uVar23 >> 0x10);
        bVar135 = (byte)((uint)uVar23 >> 0x18);
        bVar137 = (byte)uVar22;
        bVar139 = (byte)((uint)uVar22 >> 8);
        bVar141 = (byte)((uint)uVar22 >> 0x10);
        bVar143 = (byte)((uint)uVar22 >> 0x18);
        bVar145 = (byte)uVar29;
        bVar146 = (byte)((uint)uVar29 >> 8);
        bVar147 = (byte)((uint)uVar29 >> 0x10);
        bVar148 = (byte)((uint)uVar29 >> 0x18);
        bVar149 = (byte)uVar28;
        bVar150 = (byte)((uint)uVar28 >> 8);
        bVar151 = (byte)((uint)uVar28 >> 0x10);
        bVar152 = (byte)((uint)uVar28 >> 0x18);
        bVar153 = (byte)uVar27;
        bVar154 = (byte)((uint)uVar27 >> 8);
        bVar155 = (byte)((uint)uVar27 >> 0x10);
        bVar156 = (byte)((uint)uVar27 >> 0x18);
        bVar157 = (byte)uVar26;
        bVar158 = (byte)((uint)uVar26 >> 8);
        bVar159 = (byte)((uint)uVar26 >> 0x10);
        bVar160 = (byte)((uint)uVar26 >> 0x18);
        bVar161 = (byte)uVar33;
        bVar162 = (byte)((uint)uVar33 >> 8);
        bVar163 = (byte)((uint)uVar33 >> 0x10);
        bVar164 = (byte)((uint)uVar33 >> 0x18);
        bVar165 = (byte)uVar32;
        bVar166 = (byte)((uint)uVar32 >> 8);
        bVar167 = (byte)((uint)uVar32 >> 0x10);
        bVar168 = (byte)((uint)uVar32 >> 0x18);
        bVar169 = (byte)uVar31;
        bVar170 = (byte)((uint)uVar31 >> 8);
        bVar171 = (byte)((uint)uVar31 >> 0x10);
        bVar172 = (byte)((uint)uVar31 >> 0x18);
        bVar173 = (byte)uVar30;
        bVar174 = (byte)((uint)uVar30 >> 8);
        bVar175 = (byte)((uint)uVar30 >> 0x10);
        bVar176 = (byte)((uint)uVar30 >> 0x18);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
        piVar49 = coeff_contexts + lVar48 * 4;
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar52;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar53;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar54;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar55;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar56;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar57;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar58;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar51;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x24;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + 0x24;
        lVar48 = lVar48 + 4;
        cVar52 = '$';
        cVar53 = '$';
        cVar54 = '$';
        cVar55 = '$';
        cVar56 = '$';
        cVar57 = '$';
        cVar58 = '$';
        cVar51 = '$';
      } while (iVar34 != (int)lVar48);
    }
    else if (iVar35 == 8) {
      puVar41 = levels + 0xc;
      lVar48 = 0;
      cVar52 = '\x1a';
      cVar53 = '\x1a';
      cVar54 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1a';
      cVar57 = '\x1a';
      cVar58 = '\x1a';
      cVar51 = '\x1a';
      cVar59 = '\x1f';
      cVar60 = '\x1f';
      cVar61 = '\x1f';
      cVar63 = '\x1f';
      cVar64 = '\x1f';
      cVar65 = '\x1f';
      cVar66 = '\x1f';
      cVar67 = '\x1f';
      do {
        uVar3 = *(undefined8 *)(puVar41 + -0xb);
        uVar4 = *(undefined8 *)(puVar41 + 1);
        uVar5 = *(undefined8 *)puVar41;
        uVar6 = *(undefined8 *)(puVar41 + 0xc);
        uVar7 = *(undefined8 *)(puVar41 + lVar44 + -0xc);
        uVar8 = *(undefined8 *)(puVar41 + lVar44);
        uVar9 = *(undefined8 *)(puVar41 + lVar38 + -0xc);
        uVar10 = *(undefined8 *)(puVar41 + lVar38);
        uVar11 = *(undefined8 *)(puVar41 + lVar43 + -0xc);
        uVar12 = *(undefined8 *)(puVar41 + lVar43);
        bVar177 = (byte)uVar3;
        bVar178 = (byte)((ulong)uVar3 >> 8);
        bVar179 = (byte)((ulong)uVar3 >> 0x10);
        bVar180 = (byte)((ulong)uVar3 >> 0x18);
        bVar181 = (byte)((ulong)uVar3 >> 0x20);
        bVar182 = (byte)((ulong)uVar3 >> 0x28);
        bVar183 = (byte)((ulong)uVar3 >> 0x30);
        bVar184 = (byte)((ulong)uVar3 >> 0x38);
        bVar185 = (byte)uVar4;
        bVar186 = (byte)((ulong)uVar4 >> 8);
        bVar187 = (byte)((ulong)uVar4 >> 0x10);
        bVar188 = (byte)((ulong)uVar4 >> 0x18);
        bVar189 = (byte)((ulong)uVar4 >> 0x20);
        bVar190 = (byte)((ulong)uVar4 >> 0x28);
        bVar191 = (byte)((ulong)uVar4 >> 0x30);
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar101 = (byte)uVar5;
        bVar102 = (byte)((ulong)uVar5 >> 8);
        bVar103 = (byte)((ulong)uVar5 >> 0x10);
        bVar104 = (byte)((ulong)uVar5 >> 0x18);
        bVar105 = (byte)((ulong)uVar5 >> 0x20);
        bVar106 = (byte)((ulong)uVar5 >> 0x28);
        bVar107 = (byte)((ulong)uVar5 >> 0x30);
        bVar108 = (byte)((ulong)uVar5 >> 0x38);
        bVar109 = (byte)uVar6;
        bVar110 = (byte)((ulong)uVar6 >> 8);
        bVar111 = (byte)((ulong)uVar6 >> 0x10);
        bVar112 = (byte)((ulong)uVar6 >> 0x18);
        bVar113 = (byte)((ulong)uVar6 >> 0x20);
        bVar114 = (byte)((ulong)uVar6 >> 0x28);
        bVar115 = (byte)((ulong)uVar6 >> 0x30);
        bVar116 = (byte)((ulong)uVar6 >> 0x38);
        bVar117 = (byte)uVar7;
        bVar118 = (byte)((ulong)uVar7 >> 8);
        bVar119 = (byte)((ulong)uVar7 >> 0x10);
        bVar120 = (byte)((ulong)uVar7 >> 0x18);
        bVar121 = (byte)((ulong)uVar7 >> 0x20);
        bVar123 = (byte)((ulong)uVar7 >> 0x28);
        bVar125 = (byte)((ulong)uVar7 >> 0x30);
        bVar127 = (byte)((ulong)uVar7 >> 0x38);
        bVar129 = (byte)uVar8;
        bVar131 = (byte)((ulong)uVar8 >> 8);
        bVar133 = (byte)((ulong)uVar8 >> 0x10);
        bVar135 = (byte)((ulong)uVar8 >> 0x18);
        bVar137 = (byte)((ulong)uVar8 >> 0x20);
        bVar139 = (byte)((ulong)uVar8 >> 0x28);
        bVar141 = (byte)((ulong)uVar8 >> 0x30);
        bVar143 = (byte)((ulong)uVar8 >> 0x38);
        bVar145 = (byte)uVar9;
        bVar146 = (byte)((ulong)uVar9 >> 8);
        bVar147 = (byte)((ulong)uVar9 >> 0x10);
        bVar148 = (byte)((ulong)uVar9 >> 0x18);
        bVar149 = (byte)((ulong)uVar9 >> 0x20);
        bVar150 = (byte)((ulong)uVar9 >> 0x28);
        bVar151 = (byte)((ulong)uVar9 >> 0x30);
        bVar152 = (byte)((ulong)uVar9 >> 0x38);
        bVar153 = (byte)uVar10;
        bVar154 = (byte)((ulong)uVar10 >> 8);
        bVar155 = (byte)((ulong)uVar10 >> 0x10);
        bVar156 = (byte)((ulong)uVar10 >> 0x18);
        bVar157 = (byte)((ulong)uVar10 >> 0x20);
        bVar158 = (byte)((ulong)uVar10 >> 0x28);
        bVar159 = (byte)((ulong)uVar10 >> 0x30);
        bVar160 = (byte)((ulong)uVar10 >> 0x38);
        bVar161 = (byte)uVar11;
        bVar162 = (byte)((ulong)uVar11 >> 8);
        bVar163 = (byte)((ulong)uVar11 >> 0x10);
        bVar164 = (byte)((ulong)uVar11 >> 0x18);
        bVar165 = (byte)((ulong)uVar11 >> 0x20);
        bVar166 = (byte)((ulong)uVar11 >> 0x28);
        bVar167 = (byte)((ulong)uVar11 >> 0x30);
        bVar168 = (byte)((ulong)uVar11 >> 0x38);
        bVar169 = (byte)uVar12;
        bVar170 = (byte)((ulong)uVar12 >> 8);
        bVar171 = (byte)((ulong)uVar12 >> 0x10);
        bVar172 = (byte)((ulong)uVar12 >> 0x18);
        bVar173 = (byte)((ulong)uVar12 >> 0x20);
        bVar174 = (byte)((ulong)uVar12 >> 0x28);
        bVar175 = (byte)((ulong)uVar12 >> 0x30);
        bVar176 = (byte)((ulong)uVar12 >> 0x38);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
        piVar49 = coeff_contexts + lVar48 * 8;
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar52;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar53;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar54;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar55;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar56;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar57;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar58;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar51;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar59;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar60;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar61;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar63;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar64;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar65;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar66;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + cVar67;
        lVar48 = lVar48 + 2;
        puVar41 = puVar41 + 0x18;
        cVar52 = '$';
        cVar53 = '$';
        cVar54 = '$';
        cVar55 = '$';
        cVar56 = '$';
        cVar57 = '$';
        cVar58 = '$';
        cVar51 = '$';
        cVar59 = '$';
        cVar60 = '$';
        cVar61 = '$';
        cVar63 = '$';
        cVar64 = '$';
        cVar65 = '$';
        cVar66 = '$';
        cVar67 = '$';
      } while (iVar34 != (int)lVar48);
    }
    else {
      piVar49 = coeff_contexts;
      iVar40 = iVar34;
      cVar52 = '\x1a';
      cVar53 = '\x1a';
      cVar54 = '\x1a';
      cVar55 = '\x1a';
      cVar56 = '\x1a';
      cVar57 = '\x1a';
      cVar58 = '\x1a';
      cVar51 = '\x1a';
      cVar59 = '\x1a';
      cVar60 = '\x1a';
      cVar61 = '\x1a';
      cVar63 = '\x1a';
      cVar64 = '\x1a';
      cVar65 = '\x1a';
      cVar66 = '\x1a';
      cVar67 = '\x1a';
      cVar68 = '\x1f';
      cVar69 = '\x1f';
      cVar70 = '\x1f';
      cVar62 = '\x1f';
      cVar122 = '\x1f';
      cVar124 = '\x1f';
      cVar126 = '\x1f';
      cVar128 = '\x1f';
      cVar130 = '\x1f';
      cVar132 = '\x1f';
      cVar134 = '\x1f';
      cVar136 = '\x1f';
      cVar138 = '\x1f';
      cVar140 = '\x1f';
      cVar142 = '\x1f';
      cVar144 = '\x1f';
      do {
        lVar48 = 0;
        do {
          lVar47 = lVar48;
          pbVar1 = levels + lVar47 + 1;
          bVar177 = *pbVar1;
          bVar178 = pbVar1[1];
          bVar179 = pbVar1[2];
          bVar180 = pbVar1[3];
          bVar181 = pbVar1[4];
          bVar182 = pbVar1[5];
          bVar183 = pbVar1[6];
          bVar184 = pbVar1[7];
          bVar185 = pbVar1[8];
          bVar186 = pbVar1[9];
          bVar187 = pbVar1[10];
          bVar188 = pbVar1[0xb];
          bVar189 = pbVar1[0xc];
          bVar190 = pbVar1[0xd];
          bVar191 = pbVar1[0xe];
          bVar192 = pbVar1[0xf];
          pbVar1 = levels + lVar47 + iVar45;
          bVar101 = *pbVar1;
          bVar102 = pbVar1[1];
          bVar103 = pbVar1[2];
          bVar104 = pbVar1[3];
          bVar105 = pbVar1[4];
          bVar106 = pbVar1[5];
          bVar107 = pbVar1[6];
          bVar108 = pbVar1[7];
          bVar109 = pbVar1[8];
          bVar110 = pbVar1[9];
          bVar111 = pbVar1[10];
          bVar112 = pbVar1[0xb];
          bVar113 = pbVar1[0xc];
          bVar114 = pbVar1[0xd];
          bVar115 = pbVar1[0xe];
          bVar116 = pbVar1[0xf];
          pbVar1 = levels + lVar47 + lVar44;
          bVar117 = *pbVar1;
          bVar118 = pbVar1[1];
          bVar119 = pbVar1[2];
          bVar120 = pbVar1[3];
          bVar121 = pbVar1[4];
          bVar123 = pbVar1[5];
          bVar125 = pbVar1[6];
          bVar127 = pbVar1[7];
          bVar129 = pbVar1[8];
          bVar131 = pbVar1[9];
          bVar133 = pbVar1[10];
          bVar135 = pbVar1[0xb];
          bVar137 = pbVar1[0xc];
          bVar139 = pbVar1[0xd];
          bVar141 = pbVar1[0xe];
          bVar143 = pbVar1[0xf];
          pbVar1 = levels + lVar47 + lVar38;
          bVar145 = *pbVar1;
          bVar146 = pbVar1[1];
          bVar147 = pbVar1[2];
          bVar148 = pbVar1[3];
          bVar149 = pbVar1[4];
          bVar150 = pbVar1[5];
          bVar151 = pbVar1[6];
          bVar152 = pbVar1[7];
          bVar153 = pbVar1[8];
          bVar154 = pbVar1[9];
          bVar155 = pbVar1[10];
          bVar156 = pbVar1[0xb];
          bVar157 = pbVar1[0xc];
          bVar158 = pbVar1[0xd];
          bVar159 = pbVar1[0xe];
          bVar160 = pbVar1[0xf];
          pbVar1 = levels + lVar47 + lVar43;
          bVar161 = *pbVar1;
          bVar162 = pbVar1[1];
          bVar163 = pbVar1[2];
          bVar164 = pbVar1[3];
          bVar165 = pbVar1[4];
          bVar166 = pbVar1[5];
          bVar167 = pbVar1[6];
          bVar168 = pbVar1[7];
          bVar169 = pbVar1[8];
          bVar170 = pbVar1[9];
          bVar171 = pbVar1[10];
          bVar172 = pbVar1[0xb];
          bVar173 = pbVar1[0xc];
          bVar174 = pbVar1[0xd];
          bVar175 = pbVar1[0xe];
          bVar176 = pbVar1[0xf];
          bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                          ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                          ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                          ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                          ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
          bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                          ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                          ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                          ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                          ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
          bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                          ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                          ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                          ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                          ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
          bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                          ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                          ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                          ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                          ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
          bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                          ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                          ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                          ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                          ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
          bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                          ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                          ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                          ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                          ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
          bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                          ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                          ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                          ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                          ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
          bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                          ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                          ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                          ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                          ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
          bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                          ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                          ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                          ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                          ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
          bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                          ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                          ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                          ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                          ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
          bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                          ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                          ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                          ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                          ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
          bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                          ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                          ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                          ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                          ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
          bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                          ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                          ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                          ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                          ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
          bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                          ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                          ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                          ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                          ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
          bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                          ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                          ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                          ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                          ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
          bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                          ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                          ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                          ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                          ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
          piVar2 = piVar49 + lVar47;
          *piVar2 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar52;
          piVar2[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar53;
          piVar2[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar54;
          piVar2[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar55;
          piVar2[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar56;
          piVar2[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar57;
          piVar2[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar58;
          piVar2[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar51;
          piVar2[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar59;
          piVar2[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar60;
          piVar2[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar61;
          piVar2[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar63;
          piVar2[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar64;
          piVar2[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar65;
          piVar2[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar66;
          piVar2[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + cVar67;
          lVar48 = lVar47 + 0x10;
        } while (iVar35 != (int)lVar48);
        levels = levels + lVar47 + 0x14;
        piVar49 = piVar49 + lVar48;
        iVar40 = iVar40 + -1;
        cVar52 = cVar68;
        cVar53 = cVar69;
        cVar54 = cVar70;
        cVar55 = cVar62;
        cVar56 = cVar122;
        cVar57 = cVar124;
        cVar58 = cVar126;
        cVar51 = cVar128;
        cVar59 = cVar130;
        cVar60 = cVar132;
        cVar61 = cVar134;
        cVar63 = cVar136;
        cVar64 = cVar138;
        cVar65 = cVar140;
        cVar66 = cVar142;
        cVar67 = cVar144;
        cVar68 = '$';
        cVar69 = '$';
        cVar70 = '$';
        cVar62 = '$';
        cVar122 = '$';
        cVar124 = '$';
        cVar126 = '$';
        cVar128 = '$';
        cVar130 = '$';
        cVar132 = '$';
        cVar134 = '$';
        cVar136 = '$';
        cVar138 = '$';
        cVar140 = '$';
        cVar142 = '$';
        cVar144 = '$';
      } while (iVar40 != 0);
    }
  }
  else if (tx_class == '\0') {
    iVar40 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    iVar39 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    lVar43 = (long)(iVar35 + 5);
    lVar44 = (long)(iVar45 * 2);
    if (iVar35 == 0x10) {
      cVar52 = '\x06';
      cVar53 = '\x06';
      cVar55 = '\x15';
      cVar56 = '\x15';
      piVar49 = coeff_contexts;
      iVar45 = iVar34;
      cVar54 = cVar52;
      if (iVar40 == iVar39) {
        cVar57 = '\0';
        cVar58 = '\x01';
        cVar51 = '\x06';
        cVar59 = '\x06';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\x15';
        cVar64 = '\x15';
        cVar65 = '\x15';
        cVar66 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar62 = '\x15';
        cVar122 = '\x15';
        cVar124 = '\x01';
        cVar126 = '\x06';
        cVar128 = cVar51;
        cVar130 = '\x15';
        cVar132 = cVar60;
        cVar134 = cVar61;
        cVar136 = cVar63;
        cVar138 = cVar64;
        cVar140 = cVar65;
        cVar142 = cVar66;
        cVar144 = cVar67;
        cVar87 = cVar68;
        cVar88 = cVar69;
        cVar89 = cVar70;
        cVar90 = cVar62;
        cVar91 = cVar122;
      }
      else if (iVar40 < iVar39) {
        cVar57 = '\0';
        cVar58 = '\v';
        cVar51 = '\x06';
        cVar59 = '\x06';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\x15';
        cVar64 = '\x15';
        cVar65 = '\x15';
        cVar66 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar62 = '\x15';
        cVar122 = '\x15';
        cVar52 = '\v';
        cVar53 = '\v';
        cVar124 = '\v';
        cVar126 = '\v';
        cVar128 = cVar51;
        cVar130 = '\x15';
        cVar132 = cVar60;
        cVar134 = cVar61;
        cVar136 = cVar63;
        cVar138 = cVar64;
        cVar140 = cVar65;
        cVar142 = cVar66;
        cVar144 = cVar67;
        cVar87 = cVar68;
        cVar88 = cVar69;
        cVar89 = cVar70;
        cVar90 = cVar62;
        cVar91 = cVar122;
        cVar54 = cVar52;
        cVar55 = cVar53;
        cVar56 = cVar52;
      }
      else {
        cVar57 = '\x10';
        cVar58 = '\x10';
        cVar51 = '\x10';
        cVar59 = '\x10';
        cVar60 = '\x10';
        cVar61 = '\x10';
        cVar63 = '\x10';
        cVar64 = '\x10';
        cVar65 = '\x10';
        cVar66 = '\x10';
        cVar67 = '\x10';
        cVar68 = '\x10';
        cVar69 = '\x10';
        cVar70 = '\x10';
        cVar62 = '\x10';
        cVar122 = '\x10';
        cVar124 = cVar57;
        cVar126 = cVar58;
        cVar128 = cVar51;
        cVar130 = cVar59;
        cVar132 = cVar60;
        cVar134 = cVar61;
        cVar136 = cVar63;
        cVar138 = cVar64;
        cVar140 = cVar65;
        cVar142 = cVar66;
        cVar144 = cVar67;
        cVar87 = cVar68;
        cVar88 = cVar69;
        cVar89 = cVar70;
        cVar90 = cVar62;
        cVar91 = cVar122;
      }
      do {
        bVar177 = levels[1];
        bVar178 = levels[2];
        bVar179 = levels[3];
        bVar180 = levels[4];
        bVar181 = levels[5];
        bVar182 = levels[6];
        bVar183 = levels[7];
        bVar184 = levels[8];
        bVar185 = levels[9];
        bVar186 = levels[10];
        bVar187 = levels[0xb];
        bVar188 = levels[0xc];
        bVar189 = levels[0xd];
        bVar190 = levels[0xe];
        bVar191 = levels[0xf];
        bVar192 = levels[0x10];
        bVar101 = levels[2];
        bVar102 = levels[3];
        bVar103 = levels[4];
        bVar104 = levels[5];
        bVar105 = levels[6];
        bVar106 = levels[7];
        bVar107 = levels[8];
        bVar108 = levels[9];
        bVar109 = levels[10];
        bVar110 = levels[0xb];
        bVar111 = levels[0xc];
        bVar112 = levels[0xd];
        bVar113 = levels[0xe];
        bVar114 = levels[0xf];
        bVar115 = levels[0x10];
        bVar116 = levels[0x11];
        bVar117 = levels[0x14];
        bVar118 = levels[0x15];
        bVar119 = levels[0x16];
        bVar120 = levels[0x17];
        bVar121 = levels[0x18];
        bVar123 = levels[0x19];
        bVar125 = levels[0x1a];
        bVar127 = levels[0x1b];
        bVar129 = levels[0x1c];
        bVar131 = levels[0x1d];
        bVar133 = levels[0x1e];
        bVar135 = levels[0x1f];
        bVar137 = levels[0x20];
        bVar139 = levels[0x21];
        bVar141 = levels[0x22];
        bVar143 = levels[0x23];
        pbVar1 = levels + lVar43;
        bVar145 = *pbVar1;
        bVar146 = pbVar1[1];
        bVar147 = pbVar1[2];
        bVar148 = pbVar1[3];
        bVar149 = pbVar1[4];
        bVar150 = pbVar1[5];
        bVar151 = pbVar1[6];
        bVar152 = pbVar1[7];
        bVar153 = pbVar1[8];
        bVar154 = pbVar1[9];
        bVar155 = pbVar1[10];
        bVar156 = pbVar1[0xb];
        bVar157 = pbVar1[0xc];
        bVar158 = pbVar1[0xd];
        bVar159 = pbVar1[0xe];
        bVar160 = pbVar1[0xf];
        pbVar1 = levels + lVar44;
        bVar161 = *pbVar1;
        bVar162 = pbVar1[1];
        bVar163 = pbVar1[2];
        bVar164 = pbVar1[3];
        bVar165 = pbVar1[4];
        bVar166 = pbVar1[5];
        bVar167 = pbVar1[6];
        bVar168 = pbVar1[7];
        bVar169 = pbVar1[8];
        bVar170 = pbVar1[9];
        bVar171 = pbVar1[10];
        bVar172 = pbVar1[0xb];
        bVar173 = pbVar1[0xc];
        bVar174 = pbVar1[0xd];
        bVar175 = pbVar1[0xe];
        bVar176 = pbVar1[0xf];
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar57;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar58;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar51;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar59;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar60;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar61;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar63;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar64;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar65;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar66;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar67;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar68;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar69;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar70;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar62;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + cVar122;
        levels = levels + 0x14;
        iVar45 = iVar45 + -1;
        piVar49 = piVar49 + 0x10;
        cVar57 = cVar124;
        cVar58 = cVar126;
        cVar51 = cVar128;
        cVar59 = cVar130;
        cVar60 = cVar132;
        cVar61 = cVar134;
        cVar63 = cVar136;
        cVar64 = cVar138;
        cVar65 = cVar140;
        cVar66 = cVar142;
        cVar67 = cVar144;
        cVar68 = cVar87;
        cVar69 = cVar88;
        cVar70 = cVar89;
        cVar62 = cVar90;
        cVar122 = cVar91;
        cVar124 = cVar52;
        cVar126 = cVar53;
        cVar128 = '\x15';
        cVar130 = '\x15';
        cVar132 = '\x15';
        cVar134 = '\x15';
        cVar136 = '\x15';
        cVar138 = '\x15';
        cVar140 = '\x15';
        cVar142 = '\x15';
        cVar144 = '\x15';
        cVar87 = '\x15';
        cVar88 = '\x15';
        cVar89 = '\x15';
        cVar90 = '\x15';
        cVar91 = '\x15';
        cVar52 = cVar54;
        cVar53 = cVar55;
        cVar54 = cVar56;
      } while (iVar45 != 0);
    }
    else if (iVar35 == 8) {
      cVar52 = '\x06';
      cVar53 = '\x06';
      cVar54 = '\x06';
      cVar55 = '\x15';
      if (iVar34 == 8) {
        cVar56 = '\x01';
        cVar57 = '\x06';
        cVar58 = '\x06';
        cVar51 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\x01';
        cVar64 = '\x06';
        cVar65 = '\x06';
        cVar66 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
      }
      else if (iVar34 < 8) {
        cVar56 = '\v';
        cVar57 = '\x06';
        cVar58 = '\x06';
        cVar51 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\v';
        cVar64 = '\v';
        cVar65 = '\x06';
        cVar66 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar52 = '\v';
        cVar53 = '\v';
        cVar54 = '\v';
        cVar55 = '\v';
      }
      else {
        cVar56 = '\x10';
        cVar57 = '\x10';
        cVar58 = '\x10';
        cVar51 = '\x10';
        cVar59 = '\x10';
        cVar60 = '\x10';
        cVar61 = '\x10';
        cVar63 = '\x10';
        cVar64 = '\x10';
        cVar65 = '\x10';
        cVar66 = '\x10';
        cVar67 = '\x10';
        cVar68 = '\x10';
        cVar69 = '\x10';
        cVar70 = '\x10';
      }
      puVar41 = levels + 0xc;
      lVar38 = 0;
      cVar62 = '\0';
      do {
        uVar3 = *(undefined8 *)(puVar41 + -0xb);
        uVar4 = *(undefined8 *)(puVar41 + 1);
        uVar5 = *(undefined8 *)puVar41;
        uVar6 = *(undefined8 *)(puVar41 + 0xc);
        uVar7 = *(undefined8 *)(puVar41 + -10);
        uVar8 = *(undefined8 *)(puVar41 + 2);
        uVar9 = *(undefined8 *)(puVar41 + lVar43 + -0xc);
        uVar10 = *(undefined8 *)(puVar41 + lVar43);
        uVar11 = *(undefined8 *)(puVar41 + lVar44 + -0xc);
        uVar12 = *(undefined8 *)(puVar41 + lVar44);
        bVar177 = (byte)uVar3;
        bVar178 = (byte)((ulong)uVar3 >> 8);
        bVar179 = (byte)((ulong)uVar3 >> 0x10);
        bVar180 = (byte)((ulong)uVar3 >> 0x18);
        bVar181 = (byte)((ulong)uVar3 >> 0x20);
        bVar182 = (byte)((ulong)uVar3 >> 0x28);
        bVar183 = (byte)((ulong)uVar3 >> 0x30);
        bVar184 = (byte)((ulong)uVar3 >> 0x38);
        bVar185 = (byte)uVar4;
        bVar186 = (byte)((ulong)uVar4 >> 8);
        bVar187 = (byte)((ulong)uVar4 >> 0x10);
        bVar188 = (byte)((ulong)uVar4 >> 0x18);
        bVar189 = (byte)((ulong)uVar4 >> 0x20);
        bVar190 = (byte)((ulong)uVar4 >> 0x28);
        bVar191 = (byte)((ulong)uVar4 >> 0x30);
        bVar192 = (byte)((ulong)uVar4 >> 0x38);
        bVar101 = (byte)uVar5;
        bVar102 = (byte)((ulong)uVar5 >> 8);
        bVar103 = (byte)((ulong)uVar5 >> 0x10);
        bVar104 = (byte)((ulong)uVar5 >> 0x18);
        bVar105 = (byte)((ulong)uVar5 >> 0x20);
        bVar106 = (byte)((ulong)uVar5 >> 0x28);
        bVar107 = (byte)((ulong)uVar5 >> 0x30);
        bVar108 = (byte)((ulong)uVar5 >> 0x38);
        bVar109 = (byte)uVar6;
        bVar110 = (byte)((ulong)uVar6 >> 8);
        bVar111 = (byte)((ulong)uVar6 >> 0x10);
        bVar112 = (byte)((ulong)uVar6 >> 0x18);
        bVar113 = (byte)((ulong)uVar6 >> 0x20);
        bVar114 = (byte)((ulong)uVar6 >> 0x28);
        bVar115 = (byte)((ulong)uVar6 >> 0x30);
        bVar116 = (byte)((ulong)uVar6 >> 0x38);
        bVar117 = (byte)uVar7;
        bVar118 = (byte)((ulong)uVar7 >> 8);
        bVar119 = (byte)((ulong)uVar7 >> 0x10);
        bVar120 = (byte)((ulong)uVar7 >> 0x18);
        bVar121 = (byte)((ulong)uVar7 >> 0x20);
        bVar123 = (byte)((ulong)uVar7 >> 0x28);
        bVar125 = (byte)((ulong)uVar7 >> 0x30);
        bVar127 = (byte)((ulong)uVar7 >> 0x38);
        bVar129 = (byte)uVar8;
        bVar131 = (byte)((ulong)uVar8 >> 8);
        bVar133 = (byte)((ulong)uVar8 >> 0x10);
        bVar135 = (byte)((ulong)uVar8 >> 0x18);
        bVar137 = (byte)((ulong)uVar8 >> 0x20);
        bVar139 = (byte)((ulong)uVar8 >> 0x28);
        bVar141 = (byte)((ulong)uVar8 >> 0x30);
        bVar143 = (byte)((ulong)uVar8 >> 0x38);
        bVar145 = (byte)uVar9;
        bVar146 = (byte)((ulong)uVar9 >> 8);
        bVar147 = (byte)((ulong)uVar9 >> 0x10);
        bVar148 = (byte)((ulong)uVar9 >> 0x18);
        bVar149 = (byte)((ulong)uVar9 >> 0x20);
        bVar150 = (byte)((ulong)uVar9 >> 0x28);
        bVar151 = (byte)((ulong)uVar9 >> 0x30);
        bVar152 = (byte)((ulong)uVar9 >> 0x38);
        bVar153 = (byte)uVar10;
        bVar154 = (byte)((ulong)uVar10 >> 8);
        bVar155 = (byte)((ulong)uVar10 >> 0x10);
        bVar156 = (byte)((ulong)uVar10 >> 0x18);
        bVar157 = (byte)((ulong)uVar10 >> 0x20);
        bVar158 = (byte)((ulong)uVar10 >> 0x28);
        bVar159 = (byte)((ulong)uVar10 >> 0x30);
        bVar160 = (byte)((ulong)uVar10 >> 0x38);
        bVar161 = (byte)uVar11;
        bVar162 = (byte)((ulong)uVar11 >> 8);
        bVar163 = (byte)((ulong)uVar11 >> 0x10);
        bVar164 = (byte)((ulong)uVar11 >> 0x18);
        bVar165 = (byte)((ulong)uVar11 >> 0x20);
        bVar166 = (byte)((ulong)uVar11 >> 0x28);
        bVar167 = (byte)((ulong)uVar11 >> 0x30);
        bVar168 = (byte)((ulong)uVar11 >> 0x38);
        bVar169 = (byte)uVar12;
        bVar170 = (byte)((ulong)uVar12 >> 8);
        bVar171 = (byte)((ulong)uVar12 >> 0x10);
        bVar172 = (byte)((ulong)uVar12 >> 0x18);
        bVar173 = (byte)((ulong)uVar12 >> 0x20);
        bVar174 = (byte)((ulong)uVar12 >> 0x28);
        bVar175 = (byte)((ulong)uVar12 >> 0x30);
        bVar176 = (byte)((ulong)uVar12 >> 0x38);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
        piVar49 = coeff_contexts + lVar38 * 8;
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar62;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar56;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar57;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar58;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar51;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar59;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar60;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar61;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar63;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar64;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar65;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar66;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar67;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar68;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar69;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + cVar70;
        lVar38 = lVar38 + 2;
        puVar41 = puVar41 + 0x18;
        cVar62 = cVar52;
        cVar56 = cVar53;
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar51 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = cVar54;
        cVar64 = cVar55;
        cVar65 = '\x15';
        cVar66 = '\x15';
        cVar67 = '\x15';
        cVar68 = '\x15';
        cVar69 = '\x15';
        cVar70 = '\x15';
        cVar52 = '\x15';
        cVar53 = '\x15';
        cVar54 = '\x15';
        cVar55 = '\x15';
      } while (iVar34 != (int)lVar38);
    }
    else if (iVar35 == 4) {
      if (iVar34 == 4) {
        cVar52 = '\x01';
        cVar53 = '\x06';
        cVar54 = '\x06';
        cVar55 = '\x01';
        cVar56 = '\x06';
        cVar57 = '\x06';
        cVar58 = '\x15';
      }
      else {
        cVar52 = '\x10';
        cVar53 = '\x10';
        cVar54 = '\x10';
        cVar55 = '\x10';
        cVar56 = '\x10';
        cVar57 = '\x10';
        cVar58 = '\x10';
      }
      lVar38 = 0;
      cVar51 = '\0';
      cVar59 = '\x06';
      cVar60 = '\x06';
      cVar61 = '\x06';
      do {
        uVar14 = *(undefined4 *)(levels + lVar38 * 8 + 0x19);
        uVar15 = *(undefined4 *)(levels + lVar38 * 8 + 0x11);
        uVar16 = *(undefined4 *)(levels + lVar38 * 8 + 9);
        uVar17 = *(undefined4 *)(levels + lVar38 * 8 + 1);
        uVar18 = *(undefined4 *)(levels + lVar38 * 8 + 0x20);
        uVar19 = *(undefined4 *)(levels + lVar38 * 8 + 0x18);
        uVar20 = *(undefined4 *)(levels + lVar38 * 8 + 0x10);
        uVar21 = *(undefined4 *)(levels + lVar38 * 8 + 8);
        uVar22 = *(undefined4 *)(levels + lVar38 * 8 + 0x1a);
        uVar23 = *(undefined4 *)(levels + lVar38 * 8 + 0x12);
        uVar24 = *(undefined4 *)(levels + lVar38 * 8 + 10);
        uVar25 = *(undefined4 *)(levels + lVar38 * 8 + 2);
        uVar26 = *(undefined4 *)(levels + lVar38 * 8 + lVar43 + 0x18);
        uVar27 = *(undefined4 *)(levels + lVar38 * 8 + lVar43 + 0x10);
        uVar28 = *(undefined4 *)(levels + lVar38 * 8 + lVar43 + 8);
        uVar29 = *(undefined4 *)(levels + lVar38 * 8 + lVar43);
        uVar30 = *(undefined4 *)(levels + lVar38 * 8 + lVar44 + 0x18);
        uVar31 = *(undefined4 *)(levels + lVar38 * 8 + lVar44 + 0x10);
        uVar32 = *(undefined4 *)(levels + lVar38 * 8 + lVar44 + 8);
        uVar33 = *(undefined4 *)(levels + lVar38 * 8 + lVar44);
        bVar177 = (byte)uVar17;
        bVar178 = (byte)((uint)uVar17 >> 8);
        bVar179 = (byte)((uint)uVar17 >> 0x10);
        bVar180 = (byte)((uint)uVar17 >> 0x18);
        bVar181 = (byte)uVar16;
        bVar182 = (byte)((uint)uVar16 >> 8);
        bVar183 = (byte)((uint)uVar16 >> 0x10);
        bVar184 = (byte)((uint)uVar16 >> 0x18);
        bVar185 = (byte)uVar15;
        bVar186 = (byte)((uint)uVar15 >> 8);
        bVar187 = (byte)((uint)uVar15 >> 0x10);
        bVar188 = (byte)((uint)uVar15 >> 0x18);
        bVar189 = (byte)uVar14;
        bVar190 = (byte)((uint)uVar14 >> 8);
        bVar191 = (byte)((uint)uVar14 >> 0x10);
        bVar192 = (byte)((uint)uVar14 >> 0x18);
        bVar101 = (byte)uVar21;
        bVar102 = (byte)((uint)uVar21 >> 8);
        bVar103 = (byte)((uint)uVar21 >> 0x10);
        bVar104 = (byte)((uint)uVar21 >> 0x18);
        bVar105 = (byte)uVar20;
        bVar106 = (byte)((uint)uVar20 >> 8);
        bVar107 = (byte)((uint)uVar20 >> 0x10);
        bVar108 = (byte)((uint)uVar20 >> 0x18);
        bVar109 = (byte)uVar19;
        bVar110 = (byte)((uint)uVar19 >> 8);
        bVar111 = (byte)((uint)uVar19 >> 0x10);
        bVar112 = (byte)((uint)uVar19 >> 0x18);
        bVar113 = (byte)uVar18;
        bVar114 = (byte)((uint)uVar18 >> 8);
        bVar115 = (byte)((uint)uVar18 >> 0x10);
        bVar116 = (byte)((uint)uVar18 >> 0x18);
        bVar117 = (byte)uVar25;
        bVar118 = (byte)((uint)uVar25 >> 8);
        bVar119 = (byte)((uint)uVar25 >> 0x10);
        bVar120 = (byte)((uint)uVar25 >> 0x18);
        bVar121 = (byte)uVar24;
        bVar123 = (byte)((uint)uVar24 >> 8);
        bVar125 = (byte)((uint)uVar24 >> 0x10);
        bVar127 = (byte)((uint)uVar24 >> 0x18);
        bVar129 = (byte)uVar23;
        bVar131 = (byte)((uint)uVar23 >> 8);
        bVar133 = (byte)((uint)uVar23 >> 0x10);
        bVar135 = (byte)((uint)uVar23 >> 0x18);
        bVar137 = (byte)uVar22;
        bVar139 = (byte)((uint)uVar22 >> 8);
        bVar141 = (byte)((uint)uVar22 >> 0x10);
        bVar143 = (byte)((uint)uVar22 >> 0x18);
        bVar145 = (byte)uVar29;
        bVar146 = (byte)((uint)uVar29 >> 8);
        bVar147 = (byte)((uint)uVar29 >> 0x10);
        bVar148 = (byte)((uint)uVar29 >> 0x18);
        bVar149 = (byte)uVar28;
        bVar150 = (byte)((uint)uVar28 >> 8);
        bVar151 = (byte)((uint)uVar28 >> 0x10);
        bVar152 = (byte)((uint)uVar28 >> 0x18);
        bVar153 = (byte)uVar27;
        bVar154 = (byte)((uint)uVar27 >> 8);
        bVar155 = (byte)((uint)uVar27 >> 0x10);
        bVar156 = (byte)((uint)uVar27 >> 0x18);
        bVar157 = (byte)uVar26;
        bVar158 = (byte)((uint)uVar26 >> 8);
        bVar159 = (byte)((uint)uVar26 >> 0x10);
        bVar160 = (byte)((uint)uVar26 >> 0x18);
        bVar161 = (byte)uVar33;
        bVar162 = (byte)((uint)uVar33 >> 8);
        bVar163 = (byte)((uint)uVar33 >> 0x10);
        bVar164 = (byte)((uint)uVar33 >> 0x18);
        bVar165 = (byte)uVar32;
        bVar166 = (byte)((uint)uVar32 >> 8);
        bVar167 = (byte)((uint)uVar32 >> 0x10);
        bVar168 = (byte)((uint)uVar32 >> 0x18);
        bVar169 = (byte)uVar31;
        bVar170 = (byte)((uint)uVar31 >> 8);
        bVar171 = (byte)((uint)uVar31 >> 0x10);
        bVar172 = (byte)((uint)uVar31 >> 0x18);
        bVar173 = (byte)uVar30;
        bVar174 = (byte)((uint)uVar30 >> 8);
        bVar175 = (byte)((uint)uVar30 >> 0x10);
        bVar176 = (byte)((uint)uVar30 >> 0x18);
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
        piVar49 = coeff_contexts + lVar38 * 4;
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar51;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar52;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar53;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar54;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar55;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar56;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar57;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar58;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar59;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar60;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x15;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x15;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar61;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x15;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x15;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + 0x15;
        lVar38 = lVar38 + 4;
        cVar51 = '\x15';
        cVar52 = '\x15';
        cVar53 = '\x15';
        cVar54 = '\x15';
        cVar55 = '\x15';
        cVar56 = '\x15';
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
      } while (iVar34 != (int)lVar38);
    }
    else {
      cVar54 = '\x06';
      cVar53 = '\x06';
      cVar67 = '\x15';
      cVar68 = '\x15';
      cVar69 = '\x15';
      cVar55 = '\x15';
      cVar56 = '\x15';
      cVar57 = '\x15';
      cVar58 = '\x15';
      cVar51 = '\x15';
      cVar59 = '\x15';
      cVar60 = '\x15';
      cVar61 = '\x15';
      cVar63 = '\x15';
      cVar64 = '\x15';
      cVar65 = '\x15';
      cVar66 = '\x15';
      cVar52 = cVar68;
      if (iVar40 == iVar39) {
        cVar70 = '\x01';
        cVar62 = '\x01';
        cVar122 = '\x06';
        cVar67 = cVar69;
LAB_0024f90b:
        cVar126 = '\x06';
        cVar136 = '\x06';
        cVar124 = '\0';
        cVar128 = cVar68;
        cVar130 = cVar69;
        cVar132 = '\x15';
        cVar134 = '\x15';
      }
      else {
        if (iVar40 < iVar39) {
          cVar70 = '\v';
          cVar62 = '\v';
          cVar122 = '\v';
          cVar53 = '\v';
          cVar54 = '\v';
          cVar52 = cVar53;
          cVar67 = cVar54;
          goto LAB_0024f90b;
        }
        cVar62 = '\x10';
        cVar122 = '\x10';
        cVar136 = '\x10';
        cVar126 = '\x10';
        cVar55 = '\x10';
        cVar56 = '\x10';
        cVar57 = '\x10';
        cVar58 = '\x10';
        cVar51 = '\x10';
        cVar59 = '\x10';
        cVar60 = '\x10';
        cVar61 = '\x10';
        cVar63 = '\x10';
        cVar64 = '\x10';
        cVar65 = '\x10';
        cVar66 = '\x10';
        cVar124 = cVar62;
        cVar70 = cVar122;
        cVar128 = cVar62;
        cVar130 = cVar122;
        cVar132 = cVar136;
        cVar134 = cVar126;
      }
      piVar49 = coeff_contexts;
      iVar40 = iVar34;
      cVar140 = cVar128;
      cVar142 = cVar130;
      cVar144 = cVar132;
      cVar87 = cVar53;
      cVar88 = cVar134;
      cVar138 = cVar136;
      cVar89 = cVar55;
      cVar90 = cVar56;
      cVar91 = cVar57;
      cVar92 = cVar58;
      cVar93 = cVar51;
      cVar94 = cVar59;
      cVar95 = cVar60;
      cVar96 = cVar61;
      cVar97 = cVar63;
      cVar98 = cVar64;
      cVar99 = cVar65;
      cVar100 = cVar66;
      do {
        cVar86 = cVar66;
        cVar85 = cVar65;
        cVar84 = cVar64;
        cVar83 = cVar63;
        cVar82 = cVar61;
        cVar81 = cVar60;
        cVar80 = cVar59;
        cVar79 = cVar51;
        cVar78 = cVar58;
        cVar77 = cVar57;
        cVar76 = cVar56;
        cVar75 = cVar55;
        cVar74 = cVar88;
        cVar73 = cVar136;
        cVar72 = cVar122;
        cVar71 = cVar62;
        cVar122 = cVar54;
        cVar62 = cVar87;
        cVar87 = cVar53;
        lVar38 = 0;
        do {
          lVar48 = lVar38;
          pbVar1 = levels + lVar48 + iVar45;
          bVar177 = *pbVar1;
          bVar178 = pbVar1[1];
          bVar179 = pbVar1[2];
          bVar180 = pbVar1[3];
          bVar181 = pbVar1[4];
          bVar182 = pbVar1[5];
          bVar183 = pbVar1[6];
          bVar184 = pbVar1[7];
          bVar185 = pbVar1[8];
          bVar186 = pbVar1[9];
          bVar187 = pbVar1[10];
          bVar188 = pbVar1[0xb];
          bVar189 = pbVar1[0xc];
          bVar190 = pbVar1[0xd];
          bVar191 = pbVar1[0xe];
          bVar192 = pbVar1[0xf];
          pbVar1 = levels + lVar48 + 1;
          bVar101 = *pbVar1;
          bVar102 = pbVar1[1];
          bVar103 = pbVar1[2];
          bVar104 = pbVar1[3];
          bVar105 = pbVar1[4];
          bVar106 = pbVar1[5];
          bVar107 = pbVar1[6];
          bVar108 = pbVar1[7];
          bVar109 = pbVar1[8];
          bVar110 = pbVar1[9];
          bVar111 = pbVar1[10];
          bVar112 = pbVar1[0xb];
          bVar113 = pbVar1[0xc];
          bVar114 = pbVar1[0xd];
          bVar115 = pbVar1[0xe];
          bVar116 = pbVar1[0xf];
          pbVar1 = levels + lVar48 + 2;
          bVar117 = *pbVar1;
          bVar118 = pbVar1[1];
          bVar119 = pbVar1[2];
          bVar120 = pbVar1[3];
          bVar121 = pbVar1[4];
          bVar123 = pbVar1[5];
          bVar125 = pbVar1[6];
          bVar127 = pbVar1[7];
          bVar129 = pbVar1[8];
          bVar131 = pbVar1[9];
          bVar133 = pbVar1[10];
          bVar135 = pbVar1[0xb];
          bVar137 = pbVar1[0xc];
          bVar139 = pbVar1[0xd];
          bVar141 = pbVar1[0xe];
          bVar143 = pbVar1[0xf];
          pbVar1 = levels + lVar48 + lVar43;
          bVar145 = *pbVar1;
          bVar146 = pbVar1[1];
          bVar147 = pbVar1[2];
          bVar148 = pbVar1[3];
          bVar149 = pbVar1[4];
          bVar150 = pbVar1[5];
          bVar151 = pbVar1[6];
          bVar152 = pbVar1[7];
          bVar153 = pbVar1[8];
          bVar154 = pbVar1[9];
          bVar155 = pbVar1[10];
          bVar156 = pbVar1[0xb];
          bVar157 = pbVar1[0xc];
          bVar158 = pbVar1[0xd];
          bVar159 = pbVar1[0xe];
          bVar160 = pbVar1[0xf];
          pbVar1 = levels + lVar48 + lVar44;
          bVar161 = *pbVar1;
          bVar162 = pbVar1[1];
          bVar163 = pbVar1[2];
          bVar164 = pbVar1[3];
          bVar165 = pbVar1[4];
          bVar166 = pbVar1[5];
          bVar167 = pbVar1[6];
          bVar168 = pbVar1[7];
          bVar169 = pbVar1[8];
          bVar170 = pbVar1[9];
          bVar171 = pbVar1[10];
          bVar172 = pbVar1[0xb];
          bVar173 = pbVar1[0xc];
          bVar174 = pbVar1[0xd];
          bVar175 = pbVar1[0xe];
          bVar176 = pbVar1[0xf];
          bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                          ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                          ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                          ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177) +
                          ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101),0);
          bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                          ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                          ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                          ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178) +
                          ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102),0);
          bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                          ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                          ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                          ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179) +
                          ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103),0);
          bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                          ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                          ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                          ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180) +
                          ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104),0);
          bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                          ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                          ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                          ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181) +
                          ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105),0);
          bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                          ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                          ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                          ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182) +
                          ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106),0);
          bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                          ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                          ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                          ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183) +
                          ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107),0);
          bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                          ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                          ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                          ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184) +
                          ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108),0);
          bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                          ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                          ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                          ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185) +
                          ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109),0);
          bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                          ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                          ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                          ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186) +
                          ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110),0);
          bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                          ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                          ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                          ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187) +
                          ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111),0);
          bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                          ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                          ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                          ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188) +
                          ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112),0);
          bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                          ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                          ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                          ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189) +
                          ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113),0);
          bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                          ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                          ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                          ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190) +
                          ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114),0);
          bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                          ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                          ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                          ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191) +
                          ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115),0);
          bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                          ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                          ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                          ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192) +
                          ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116),0);
          piVar2 = piVar49 + lVar48;
          *piVar2 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar124;
          piVar2[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar70;
          piVar2[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + cVar138;
          piVar2[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + cVar126;
          piVar2[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + cVar89;
          piVar2[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + cVar90;
          piVar2[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + cVar91;
          piVar2[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + cVar92;
          piVar2[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + cVar93;
          piVar2[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + cVar94;
          piVar2[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + cVar95;
          piVar2[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + cVar96;
          piVar2[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + cVar97;
          piVar2[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + cVar98;
          piVar2[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + cVar99;
          piVar2[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + cVar100;
          lVar38 = lVar48 + 0x10;
          cVar124 = cVar128;
          cVar70 = cVar130;
          cVar138 = cVar132;
          cVar126 = cVar134;
        } while (iVar35 != (int)lVar38);
        levels = levels + lVar48 + 0x14;
        piVar49 = piVar49 + lVar38;
        iVar40 = iVar40 + -1;
        cVar128 = cVar140;
        cVar130 = cVar142;
        cVar132 = cVar144;
        cVar134 = cVar74;
        cVar140 = cVar68;
        cVar142 = cVar69;
        cVar144 = '\x15';
        cVar53 = cVar52;
        cVar54 = cVar67;
        cVar136 = '\x15';
        cVar88 = '\x15';
        cVar55 = '\x15';
        cVar56 = '\x15';
        cVar57 = '\x15';
        cVar58 = '\x15';
        cVar51 = '\x15';
        cVar59 = '\x15';
        cVar60 = '\x15';
        cVar61 = '\x15';
        cVar63 = '\x15';
        cVar64 = '\x15';
        cVar65 = '\x15';
        cVar66 = '\x15';
        cVar124 = cVar71;
        cVar70 = cVar72;
        cVar138 = cVar73;
        cVar126 = cVar74;
        cVar89 = cVar75;
        cVar90 = cVar76;
        cVar91 = cVar77;
        cVar92 = cVar78;
        cVar93 = cVar79;
        cVar94 = cVar80;
        cVar95 = cVar81;
        cVar96 = cVar82;
        cVar97 = cVar83;
        cVar98 = cVar84;
        cVar99 = cVar85;
        cVar100 = cVar86;
      } while (iVar40 != 0);
    }
    *coeff_contexts = '\0';
  }
  else if (iVar35 == 4) {
    lVar43 = 0;
    do {
      uVar14 = *(undefined4 *)(levels + lVar43 * 8 + 0x19);
      uVar15 = *(undefined4 *)(levels + lVar43 * 8 + 0x11);
      uVar16 = *(undefined4 *)(levels + lVar43 * 8 + 9);
      uVar17 = *(undefined4 *)(levels + lVar43 * 8 + 1);
      uVar18 = *(undefined4 *)(levels + lVar43 * 8 + 0x20);
      uVar19 = *(undefined4 *)(levels + lVar43 * 8 + 0x18);
      uVar20 = *(undefined4 *)(levels + lVar43 * 8 + 0x10);
      uVar21 = *(undefined4 *)(levels + lVar43 * 8 + 8);
      uVar22 = *(undefined4 *)(levels + lVar43 * 8 + 0x1a);
      uVar23 = *(undefined4 *)(levels + lVar43 * 8 + 0x12);
      uVar24 = *(undefined4 *)(levels + lVar43 * 8 + 10);
      uVar25 = *(undefined4 *)(levels + lVar43 * 8 + 2);
      uVar26 = *(undefined4 *)(levels + lVar43 * 8 + 0x1b);
      uVar27 = *(undefined4 *)(levels + lVar43 * 8 + 0x13);
      uVar28 = *(undefined4 *)(levels + lVar43 * 8 + 0xb);
      uVar29 = *(undefined4 *)(levels + lVar43 * 8 + 3);
      uVar30 = *(undefined4 *)(levels + lVar43 * 8 + 0x1c);
      uVar31 = *(undefined4 *)(levels + lVar43 * 8 + 0x14);
      uVar32 = *(undefined4 *)(levels + lVar43 * 8 + 0xc);
      uVar33 = *(undefined4 *)(levels + lVar43 * 8 + 4);
      bVar177 = (byte)uVar17;
      bVar178 = (byte)((uint)uVar17 >> 8);
      bVar179 = (byte)((uint)uVar17 >> 0x10);
      bVar180 = (byte)((uint)uVar17 >> 0x18);
      bVar181 = (byte)uVar16;
      bVar182 = (byte)((uint)uVar16 >> 8);
      bVar183 = (byte)((uint)uVar16 >> 0x10);
      bVar184 = (byte)((uint)uVar16 >> 0x18);
      bVar185 = (byte)uVar15;
      bVar186 = (byte)((uint)uVar15 >> 8);
      bVar187 = (byte)((uint)uVar15 >> 0x10);
      bVar188 = (byte)((uint)uVar15 >> 0x18);
      bVar189 = (byte)uVar14;
      bVar190 = (byte)((uint)uVar14 >> 8);
      bVar191 = (byte)((uint)uVar14 >> 0x10);
      bVar192 = (byte)((uint)uVar14 >> 0x18);
      bVar101 = (byte)uVar21;
      bVar102 = (byte)((uint)uVar21 >> 8);
      bVar103 = (byte)((uint)uVar21 >> 0x10);
      bVar104 = (byte)((uint)uVar21 >> 0x18);
      bVar105 = (byte)uVar20;
      bVar106 = (byte)((uint)uVar20 >> 8);
      bVar107 = (byte)((uint)uVar20 >> 0x10);
      bVar108 = (byte)((uint)uVar20 >> 0x18);
      bVar109 = (byte)uVar19;
      bVar110 = (byte)((uint)uVar19 >> 8);
      bVar111 = (byte)((uint)uVar19 >> 0x10);
      bVar112 = (byte)((uint)uVar19 >> 0x18);
      bVar113 = (byte)uVar18;
      bVar114 = (byte)((uint)uVar18 >> 8);
      bVar115 = (byte)((uint)uVar18 >> 0x10);
      bVar116 = (byte)((uint)uVar18 >> 0x18);
      bVar117 = (byte)uVar25;
      bVar118 = (byte)((uint)uVar25 >> 8);
      bVar119 = (byte)((uint)uVar25 >> 0x10);
      bVar120 = (byte)((uint)uVar25 >> 0x18);
      bVar121 = (byte)uVar24;
      bVar123 = (byte)((uint)uVar24 >> 8);
      bVar125 = (byte)((uint)uVar24 >> 0x10);
      bVar127 = (byte)((uint)uVar24 >> 0x18);
      bVar129 = (byte)uVar23;
      bVar131 = (byte)((uint)uVar23 >> 8);
      bVar133 = (byte)((uint)uVar23 >> 0x10);
      bVar135 = (byte)((uint)uVar23 >> 0x18);
      bVar137 = (byte)uVar22;
      bVar139 = (byte)((uint)uVar22 >> 8);
      bVar141 = (byte)((uint)uVar22 >> 0x10);
      bVar143 = (byte)((uint)uVar22 >> 0x18);
      bVar145 = (byte)uVar29;
      bVar146 = (byte)((uint)uVar29 >> 8);
      bVar147 = (byte)((uint)uVar29 >> 0x10);
      bVar148 = (byte)((uint)uVar29 >> 0x18);
      bVar149 = (byte)uVar28;
      bVar150 = (byte)((uint)uVar28 >> 8);
      bVar151 = (byte)((uint)uVar28 >> 0x10);
      bVar152 = (byte)((uint)uVar28 >> 0x18);
      bVar153 = (byte)uVar27;
      bVar154 = (byte)((uint)uVar27 >> 8);
      bVar155 = (byte)((uint)uVar27 >> 0x10);
      bVar156 = (byte)((uint)uVar27 >> 0x18);
      bVar157 = (byte)uVar26;
      bVar158 = (byte)((uint)uVar26 >> 8);
      bVar159 = (byte)((uint)uVar26 >> 0x10);
      bVar160 = (byte)((uint)uVar26 >> 0x18);
      bVar161 = (byte)uVar33;
      bVar162 = (byte)((uint)uVar33 >> 8);
      bVar163 = (byte)((uint)uVar33 >> 0x10);
      bVar164 = (byte)((uint)uVar33 >> 0x18);
      bVar165 = (byte)uVar32;
      bVar166 = (byte)((uint)uVar32 >> 8);
      bVar167 = (byte)((uint)uVar32 >> 0x10);
      bVar168 = (byte)((uint)uVar32 >> 0x18);
      bVar169 = (byte)uVar31;
      bVar170 = (byte)((uint)uVar31 >> 8);
      bVar171 = (byte)((uint)uVar31 >> 0x10);
      bVar172 = (byte)((uint)uVar31 >> 0x18);
      bVar173 = (byte)uVar30;
      bVar174 = (byte)((uint)uVar30 >> 8);
      bVar175 = (byte)((uint)uVar30 >> 0x10);
      bVar176 = (byte)((uint)uVar30 >> 0x18);
      bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                      ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                      ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                      ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                      ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
      bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                      ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                      ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                      ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                      ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
      bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                      ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                      ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                      ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                      ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
      bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                      ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                      ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                      ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                      ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
      bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                      ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                      ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                      ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                      ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
      bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                      ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                      ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                      ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                      ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
      bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                      ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                      ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                      ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                      ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
      bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                      ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                      ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                      ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                      ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
      bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                      ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                      ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                      ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                      ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
      bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                      ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                      ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                      ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                      ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
      bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                      ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                      ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                      ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                      ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
      bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                      ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                      ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                      ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                      ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
      bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                      ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                      ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                      ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                      ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
      bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                      ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                      ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                      ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                      ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
      bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                      ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                      ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                      ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                      ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
      bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                      ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                      ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                      ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                      ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
      piVar49 = coeff_contexts + lVar43 * 4;
      *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + 0x1a;
      piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + 0x1f;
      piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
      piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x24;
      piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x1a;
      piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x1f;
      piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
      piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x24;
      piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x1a;
      piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x1f;
      piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
      piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
      piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x1a;
      piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x1f;
      piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
      piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + 0x24;
      lVar43 = lVar43 + 4;
    } while (iVar34 != (int)lVar43);
  }
  else if (iVar35 == 8) {
    puVar41 = levels + 1;
    lVar43 = 0;
    do {
      uVar3 = *(undefined8 *)puVar41;
      uVar4 = *(undefined8 *)(puVar41 + 0xc);
      uVar5 = *(undefined8 *)(puVar41 + 0xb);
      uVar6 = *(undefined8 *)(puVar41 + 0x17);
      uVar7 = *(undefined8 *)(puVar41 + 1);
      uVar8 = *(undefined8 *)(puVar41 + 0xd);
      uVar9 = *(undefined8 *)(puVar41 + 2);
      uVar10 = *(undefined8 *)(puVar41 + 0xe);
      uVar11 = *(undefined8 *)(puVar41 + 3);
      uVar12 = *(undefined8 *)(puVar41 + 0xf);
      bVar177 = (byte)uVar3;
      bVar178 = (byte)((ulong)uVar3 >> 8);
      bVar179 = (byte)((ulong)uVar3 >> 0x10);
      bVar180 = (byte)((ulong)uVar3 >> 0x18);
      bVar181 = (byte)((ulong)uVar3 >> 0x20);
      bVar182 = (byte)((ulong)uVar3 >> 0x28);
      bVar183 = (byte)((ulong)uVar3 >> 0x30);
      bVar184 = (byte)((ulong)uVar3 >> 0x38);
      bVar185 = (byte)uVar4;
      bVar186 = (byte)((ulong)uVar4 >> 8);
      bVar187 = (byte)((ulong)uVar4 >> 0x10);
      bVar188 = (byte)((ulong)uVar4 >> 0x18);
      bVar189 = (byte)((ulong)uVar4 >> 0x20);
      bVar190 = (byte)((ulong)uVar4 >> 0x28);
      bVar191 = (byte)((ulong)uVar4 >> 0x30);
      bVar192 = (byte)((ulong)uVar4 >> 0x38);
      bVar101 = (byte)uVar5;
      bVar102 = (byte)((ulong)uVar5 >> 8);
      bVar103 = (byte)((ulong)uVar5 >> 0x10);
      bVar104 = (byte)((ulong)uVar5 >> 0x18);
      bVar105 = (byte)((ulong)uVar5 >> 0x20);
      bVar106 = (byte)((ulong)uVar5 >> 0x28);
      bVar107 = (byte)((ulong)uVar5 >> 0x30);
      bVar108 = (byte)((ulong)uVar5 >> 0x38);
      bVar109 = (byte)uVar6;
      bVar110 = (byte)((ulong)uVar6 >> 8);
      bVar111 = (byte)((ulong)uVar6 >> 0x10);
      bVar112 = (byte)((ulong)uVar6 >> 0x18);
      bVar113 = (byte)((ulong)uVar6 >> 0x20);
      bVar114 = (byte)((ulong)uVar6 >> 0x28);
      bVar115 = (byte)((ulong)uVar6 >> 0x30);
      bVar116 = (byte)((ulong)uVar6 >> 0x38);
      bVar117 = (byte)uVar7;
      bVar118 = (byte)((ulong)uVar7 >> 8);
      bVar119 = (byte)((ulong)uVar7 >> 0x10);
      bVar120 = (byte)((ulong)uVar7 >> 0x18);
      bVar121 = (byte)((ulong)uVar7 >> 0x20);
      bVar123 = (byte)((ulong)uVar7 >> 0x28);
      bVar125 = (byte)((ulong)uVar7 >> 0x30);
      bVar127 = (byte)((ulong)uVar7 >> 0x38);
      bVar129 = (byte)uVar8;
      bVar131 = (byte)((ulong)uVar8 >> 8);
      bVar133 = (byte)((ulong)uVar8 >> 0x10);
      bVar135 = (byte)((ulong)uVar8 >> 0x18);
      bVar137 = (byte)((ulong)uVar8 >> 0x20);
      bVar139 = (byte)((ulong)uVar8 >> 0x28);
      bVar141 = (byte)((ulong)uVar8 >> 0x30);
      bVar143 = (byte)((ulong)uVar8 >> 0x38);
      bVar145 = (byte)uVar9;
      bVar146 = (byte)((ulong)uVar9 >> 8);
      bVar147 = (byte)((ulong)uVar9 >> 0x10);
      bVar148 = (byte)((ulong)uVar9 >> 0x18);
      bVar149 = (byte)((ulong)uVar9 >> 0x20);
      bVar150 = (byte)((ulong)uVar9 >> 0x28);
      bVar151 = (byte)((ulong)uVar9 >> 0x30);
      bVar152 = (byte)((ulong)uVar9 >> 0x38);
      bVar153 = (byte)uVar10;
      bVar154 = (byte)((ulong)uVar10 >> 8);
      bVar155 = (byte)((ulong)uVar10 >> 0x10);
      bVar156 = (byte)((ulong)uVar10 >> 0x18);
      bVar157 = (byte)((ulong)uVar10 >> 0x20);
      bVar158 = (byte)((ulong)uVar10 >> 0x28);
      bVar159 = (byte)((ulong)uVar10 >> 0x30);
      bVar160 = (byte)((ulong)uVar10 >> 0x38);
      bVar161 = (byte)uVar11;
      bVar162 = (byte)((ulong)uVar11 >> 8);
      bVar163 = (byte)((ulong)uVar11 >> 0x10);
      bVar164 = (byte)((ulong)uVar11 >> 0x18);
      bVar165 = (byte)((ulong)uVar11 >> 0x20);
      bVar166 = (byte)((ulong)uVar11 >> 0x28);
      bVar167 = (byte)((ulong)uVar11 >> 0x30);
      bVar168 = (byte)((ulong)uVar11 >> 0x38);
      bVar169 = (byte)uVar12;
      bVar170 = (byte)((ulong)uVar12 >> 8);
      bVar171 = (byte)((ulong)uVar12 >> 0x10);
      bVar172 = (byte)((ulong)uVar12 >> 0x18);
      bVar173 = (byte)((ulong)uVar12 >> 0x20);
      bVar174 = (byte)((ulong)uVar12 >> 0x28);
      bVar175 = (byte)((ulong)uVar12 >> 0x30);
      bVar176 = (byte)((ulong)uVar12 >> 0x38);
      bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                      ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                      ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                      ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101) +
                      ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177),0);
      bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                      ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                      ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                      ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102) +
                      ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178),0);
      bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                      ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                      ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                      ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103) +
                      ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179),0);
      bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                      ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                      ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                      ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104) +
                      ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180),0);
      bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                      ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                      ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                      ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105) +
                      ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181),0);
      bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                      ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                      ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                      ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106) +
                      ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182),0);
      bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                      ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                      ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                      ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107) +
                      ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183),0);
      bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                      ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                      ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                      ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108) +
                      ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184),0);
      bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                      ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                      ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                      ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109) +
                      ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185),0);
      bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                      ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                      ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                      ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110) +
                      ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186),0);
      bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                      ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                      ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                      ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111) +
                      ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187),0);
      bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                      ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                      ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                      ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112) +
                      ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188),0);
      bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                      ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                      ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                      ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113) +
                      ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189),0);
      bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                      ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                      ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                      ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114) +
                      ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190),0);
      bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                      ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                      ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                      ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115) +
                      ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191),0);
      bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                      ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                      ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                      ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116) +
                      ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192),0);
      piVar49 = coeff_contexts + lVar43 * 8;
      *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + 0x1a;
      piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + 0x1f;
      piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
      piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x24;
      piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x24;
      piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x24;
      piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
      piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x24;
      piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x1a;
      piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x1f;
      piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
      piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
      piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
      piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
      piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
      piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + 0x24;
      lVar43 = lVar43 + 2;
      puVar41 = puVar41 + 0x18;
    } while (iVar34 != (int)lVar43);
  }
  else {
    piVar49 = coeff_contexts;
    iVar40 = iVar34;
    do {
      levels = levels + 4;
      iVar39 = iVar35;
      cVar52 = '\x1a';
      cVar53 = '\x1f';
      do {
        pbVar1 = levels + (long)iVar45 + -4;
        bVar177 = *pbVar1;
        bVar178 = pbVar1[1];
        bVar179 = pbVar1[2];
        bVar180 = pbVar1[3];
        bVar181 = pbVar1[4];
        bVar182 = pbVar1[5];
        bVar183 = pbVar1[6];
        bVar184 = pbVar1[7];
        bVar185 = pbVar1[8];
        bVar186 = pbVar1[9];
        bVar187 = pbVar1[10];
        bVar188 = pbVar1[0xb];
        bVar189 = pbVar1[0xc];
        bVar190 = pbVar1[0xd];
        bVar191 = pbVar1[0xe];
        bVar192 = pbVar1[0xf];
        bVar101 = levels[-3];
        bVar102 = levels[-2];
        bVar103 = levels[-1];
        bVar104 = *levels;
        bVar105 = levels[1];
        bVar106 = levels[2];
        bVar107 = levels[3];
        bVar108 = levels[4];
        bVar109 = levels[5];
        bVar110 = levels[6];
        bVar111 = levels[7];
        bVar112 = levels[8];
        bVar113 = levels[9];
        bVar114 = levels[10];
        bVar115 = levels[0xb];
        bVar116 = levels[0xc];
        bVar117 = levels[-2];
        bVar118 = levels[-1];
        bVar119 = *levels;
        bVar120 = levels[1];
        bVar121 = levels[2];
        bVar123 = levels[3];
        bVar125 = levels[4];
        bVar127 = levels[5];
        bVar129 = levels[6];
        bVar131 = levels[7];
        bVar133 = levels[8];
        bVar135 = levels[9];
        bVar137 = levels[10];
        bVar139 = levels[0xb];
        bVar141 = levels[0xc];
        bVar143 = levels[0xd];
        bVar145 = levels[-1];
        bVar146 = *levels;
        bVar147 = levels[1];
        bVar148 = levels[2];
        bVar149 = levels[3];
        bVar150 = levels[4];
        bVar151 = levels[5];
        bVar152 = levels[6];
        bVar153 = levels[7];
        bVar154 = levels[8];
        bVar155 = levels[9];
        bVar156 = levels[10];
        bVar157 = levels[0xb];
        bVar158 = levels[0xc];
        bVar159 = levels[0xd];
        bVar160 = levels[0xe];
        bVar161 = *levels;
        bVar162 = levels[1];
        bVar163 = levels[2];
        bVar164 = levels[3];
        bVar165 = levels[4];
        bVar166 = levels[5];
        bVar167 = levels[6];
        bVar168 = levels[7];
        bVar169 = levels[8];
        bVar170 = levels[9];
        bVar171 = levels[10];
        bVar172 = levels[0xb];
        bVar173 = levels[0xc];
        bVar174 = levels[0xd];
        bVar175 = levels[0xe];
        bVar176 = levels[0xf];
        bVar177 = pavgb(((3 < bVar161) * '\x03' | (3 >= bVar161) * bVar161) +
                        ((3 < bVar145) * '\x03' | (3 >= bVar145) * bVar145) +
                        ((3 < bVar117) * '\x03' | (3 >= bVar117) * bVar117) +
                        ((3 < bVar177) * '\x03' | (3 >= bVar177) * bVar177) +
                        ((3 < bVar101) * '\x03' | (3 >= bVar101) * bVar101),0);
        bVar178 = pavgb(((3 < bVar162) * '\x03' | (3 >= bVar162) * bVar162) +
                        ((3 < bVar146) * '\x03' | (3 >= bVar146) * bVar146) +
                        ((3 < bVar118) * '\x03' | (3 >= bVar118) * bVar118) +
                        ((3 < bVar178) * '\x03' | (3 >= bVar178) * bVar178) +
                        ((3 < bVar102) * '\x03' | (3 >= bVar102) * bVar102),0);
        bVar179 = pavgb(((3 < bVar163) * '\x03' | (3 >= bVar163) * bVar163) +
                        ((3 < bVar147) * '\x03' | (3 >= bVar147) * bVar147) +
                        ((3 < bVar119) * '\x03' | (3 >= bVar119) * bVar119) +
                        ((3 < bVar179) * '\x03' | (3 >= bVar179) * bVar179) +
                        ((3 < bVar103) * '\x03' | (3 >= bVar103) * bVar103),0);
        bVar180 = pavgb(((3 < bVar164) * '\x03' | (3 >= bVar164) * bVar164) +
                        ((3 < bVar148) * '\x03' | (3 >= bVar148) * bVar148) +
                        ((3 < bVar120) * '\x03' | (3 >= bVar120) * bVar120) +
                        ((3 < bVar180) * '\x03' | (3 >= bVar180) * bVar180) +
                        ((3 < bVar104) * '\x03' | (3 >= bVar104) * bVar104),0);
        bVar181 = pavgb(((3 < bVar165) * '\x03' | (3 >= bVar165) * bVar165) +
                        ((3 < bVar149) * '\x03' | (3 >= bVar149) * bVar149) +
                        ((3 < bVar121) * '\x03' | (3 >= bVar121) * bVar121) +
                        ((3 < bVar181) * '\x03' | (3 >= bVar181) * bVar181) +
                        ((3 < bVar105) * '\x03' | (3 >= bVar105) * bVar105),0);
        bVar182 = pavgb(((3 < bVar166) * '\x03' | (3 >= bVar166) * bVar166) +
                        ((3 < bVar150) * '\x03' | (3 >= bVar150) * bVar150) +
                        ((3 < bVar123) * '\x03' | (3 >= bVar123) * bVar123) +
                        ((3 < bVar182) * '\x03' | (3 >= bVar182) * bVar182) +
                        ((3 < bVar106) * '\x03' | (3 >= bVar106) * bVar106),0);
        bVar183 = pavgb(((3 < bVar167) * '\x03' | (3 >= bVar167) * bVar167) +
                        ((3 < bVar151) * '\x03' | (3 >= bVar151) * bVar151) +
                        ((3 < bVar125) * '\x03' | (3 >= bVar125) * bVar125) +
                        ((3 < bVar183) * '\x03' | (3 >= bVar183) * bVar183) +
                        ((3 < bVar107) * '\x03' | (3 >= bVar107) * bVar107),0);
        bVar184 = pavgb(((3 < bVar168) * '\x03' | (3 >= bVar168) * bVar168) +
                        ((3 < bVar152) * '\x03' | (3 >= bVar152) * bVar152) +
                        ((3 < bVar127) * '\x03' | (3 >= bVar127) * bVar127) +
                        ((3 < bVar184) * '\x03' | (3 >= bVar184) * bVar184) +
                        ((3 < bVar108) * '\x03' | (3 >= bVar108) * bVar108),0);
        bVar185 = pavgb(((3 < bVar169) * '\x03' | (3 >= bVar169) * bVar169) +
                        ((3 < bVar153) * '\x03' | (3 >= bVar153) * bVar153) +
                        ((3 < bVar129) * '\x03' | (3 >= bVar129) * bVar129) +
                        ((3 < bVar185) * '\x03' | (3 >= bVar185) * bVar185) +
                        ((3 < bVar109) * '\x03' | (3 >= bVar109) * bVar109),0);
        bVar186 = pavgb(((3 < bVar170) * '\x03' | (3 >= bVar170) * bVar170) +
                        ((3 < bVar154) * '\x03' | (3 >= bVar154) * bVar154) +
                        ((3 < bVar131) * '\x03' | (3 >= bVar131) * bVar131) +
                        ((3 < bVar186) * '\x03' | (3 >= bVar186) * bVar186) +
                        ((3 < bVar110) * '\x03' | (3 >= bVar110) * bVar110),0);
        bVar187 = pavgb(((3 < bVar171) * '\x03' | (3 >= bVar171) * bVar171) +
                        ((3 < bVar155) * '\x03' | (3 >= bVar155) * bVar155) +
                        ((3 < bVar133) * '\x03' | (3 >= bVar133) * bVar133) +
                        ((3 < bVar187) * '\x03' | (3 >= bVar187) * bVar187) +
                        ((3 < bVar111) * '\x03' | (3 >= bVar111) * bVar111),0);
        bVar188 = pavgb(((3 < bVar172) * '\x03' | (3 >= bVar172) * bVar172) +
                        ((3 < bVar156) * '\x03' | (3 >= bVar156) * bVar156) +
                        ((3 < bVar135) * '\x03' | (3 >= bVar135) * bVar135) +
                        ((3 < bVar188) * '\x03' | (3 >= bVar188) * bVar188) +
                        ((3 < bVar112) * '\x03' | (3 >= bVar112) * bVar112),0);
        bVar189 = pavgb(((3 < bVar173) * '\x03' | (3 >= bVar173) * bVar173) +
                        ((3 < bVar157) * '\x03' | (3 >= bVar157) * bVar157) +
                        ((3 < bVar137) * '\x03' | (3 >= bVar137) * bVar137) +
                        ((3 < bVar189) * '\x03' | (3 >= bVar189) * bVar189) +
                        ((3 < bVar113) * '\x03' | (3 >= bVar113) * bVar113),0);
        bVar190 = pavgb(((3 < bVar174) * '\x03' | (3 >= bVar174) * bVar174) +
                        ((3 < bVar158) * '\x03' | (3 >= bVar158) * bVar158) +
                        ((3 < bVar139) * '\x03' | (3 >= bVar139) * bVar139) +
                        ((3 < bVar190) * '\x03' | (3 >= bVar190) * bVar190) +
                        ((3 < bVar114) * '\x03' | (3 >= bVar114) * bVar114),0);
        bVar191 = pavgb(((3 < bVar175) * '\x03' | (3 >= bVar175) * bVar175) +
                        ((3 < bVar159) * '\x03' | (3 >= bVar159) * bVar159) +
                        ((3 < bVar141) * '\x03' | (3 >= bVar141) * bVar141) +
                        ((3 < bVar191) * '\x03' | (3 >= bVar191) * bVar191) +
                        ((3 < bVar115) * '\x03' | (3 >= bVar115) * bVar115),0);
        bVar192 = pavgb(((3 < bVar176) * '\x03' | (3 >= bVar176) * bVar176) +
                        ((3 < bVar160) * '\x03' | (3 >= bVar160) * bVar160) +
                        ((3 < bVar143) * '\x03' | (3 >= bVar143) * bVar143) +
                        ((3 < bVar192) * '\x03' | (3 >= bVar192) * bVar192) +
                        ((3 < bVar116) * '\x03' | (3 >= bVar116) * bVar116),0);
        *piVar49 = ((4 < bVar177) * '\x04' | (4 >= bVar177) * bVar177) + cVar52;
        piVar49[1] = ((4 < bVar178) * '\x04' | (4 >= bVar178) * bVar178) + cVar53;
        piVar49[2] = ((4 < bVar179) * '\x04' | (4 >= bVar179) * bVar179) + 0x24;
        piVar49[3] = ((4 < bVar180) * '\x04' | (4 >= bVar180) * bVar180) + 0x24;
        piVar49[4] = ((4 < bVar181) * '\x04' | (4 >= bVar181) * bVar181) + 0x24;
        piVar49[5] = ((4 < bVar182) * '\x04' | (4 >= bVar182) * bVar182) + 0x24;
        piVar49[6] = ((4 < bVar183) * '\x04' | (4 >= bVar183) * bVar183) + 0x24;
        piVar49[7] = ((4 < bVar184) * '\x04' | (4 >= bVar184) * bVar184) + 0x24;
        piVar49[8] = ((4 < bVar185) * '\x04' | (4 >= bVar185) * bVar185) + 0x24;
        piVar49[9] = ((4 < bVar186) * '\x04' | (4 >= bVar186) * bVar186) + 0x24;
        piVar49[10] = ((4 < bVar187) * '\x04' | (4 >= bVar187) * bVar187) + 0x24;
        piVar49[0xb] = ((4 < bVar188) * '\x04' | (4 >= bVar188) * bVar188) + 0x24;
        piVar49[0xc] = ((4 < bVar189) * '\x04' | (4 >= bVar189) * bVar189) + 0x24;
        piVar49[0xd] = ((4 < bVar190) * '\x04' | (4 >= bVar190) * bVar190) + 0x24;
        piVar49[0xe] = ((4 < bVar191) * '\x04' | (4 >= bVar191) * bVar191) + 0x24;
        piVar49[0xf] = ((4 < bVar192) * '\x04' | (4 >= bVar192) * bVar192) + 0x24;
        piVar49 = piVar49 + 0x10;
        levels = levels + 0x10;
        iVar39 = iVar39 + -0x10;
        cVar52 = '$';
        cVar53 = '$';
      } while (iVar39 != 0);
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
  }
  uVar42 = (uint)tx_size;
  if (uVar42 < 0x11) {
    uVar46 = 3;
    if ((uVar42 - 0xb < 2) || (uVar42 == 4)) goto LAB_0024fbbc;
  }
  else {
    if (uVar42 == 0x11) {
      uVar46 = 9;
      goto LAB_0024fbbc;
    }
    if (uVar42 == 0x12) {
      uVar46 = 10;
      goto LAB_0024fbbc;
    }
  }
  uVar46 = uVar50;
LAB_0024fbbc:
  bVar177 = *(byte *)(tx_size_high_log2 + uVar46) & 0x1f;
  iVar35 = iVar34 << bVar177;
  sVar13 = scan[iVar37];
  iVar45 = iVar35 + 7;
  if (-1 < iVar34 << bVar177) {
    iVar45 = iVar35;
  }
  if (iVar37 <= iVar45 >> 3) {
    coeff_contexts[sVar13] = '\x01';
    return;
  }
  iVar45 = iVar35 + 3;
  if (-1 < iVar34 << bVar177) {
    iVar45 = iVar35;
  }
  if (iVar37 <= iVar45 >> 2) {
    coeff_contexts[sVar13] = '\x02';
    return;
  }
  coeff_contexts[sVar13] = '\x03';
  return;
}

Assistant:

void av1_get_nz_map_contexts_sse2(const uint8_t *const levels,
                                  const int16_t *const scan, const uint16_t eob,
                                  const TX_SIZE tx_size,
                                  const TX_CLASS tx_class,
                                  int8_t *const coeff_contexts) {
  const int last_idx = eob - 1;
  if (!last_idx) {
    coeff_contexts[0] = 0;
    return;
  }

  const int real_width = tx_size_wide[tx_size];
  const int real_height = tx_size_high[tx_size];
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  const int stride = height + TX_PAD_HOR;
  ptrdiff_t offsets[3];

  /* coeff_contexts must be 16 byte aligned. */
  assert(!((intptr_t)coeff_contexts & 0xf));

  if (tx_class == TX_CLASS_2D) {
    offsets[0] = 0 * stride + 2;
    offsets[1] = 1 * stride + 1;
    offsets[2] = 2 * stride + 0;

    if (height == 4) {
      get_4_nz_map_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 16) {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    }
  } else if (tx_class == TX_CLASS_HORIZ) {
    offsets[0] = 2 * stride;
    offsets[1] = 3 * stride;
    offsets[2] = 4 * stride;
    if (height == 4) {
      get_4_nz_map_contexts_hor(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_hor(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_hor(levels, width, height, offsets,
                                 coeff_contexts);
    }
  } else {  // TX_CLASS_VERT
    offsets[0] = 2;
    offsets[1] = 3;
    offsets[2] = 4;
    if (height == 4) {
      get_4_nz_map_contexts_ver(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_ver(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_ver(levels, width, height, offsets,
                                 coeff_contexts);
    }
  }

  const int bhl = get_txb_bhl(tx_size);
  const int pos = scan[last_idx];
  if (last_idx <= (width << bhl) / 8)
    coeff_contexts[pos] = 1;
  else if (last_idx <= (width << bhl) / 4)
    coeff_contexts[pos] = 2;
  else
    coeff_contexts[pos] = 3;
}